

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetDeprecatedWarningsAsErrors(cmake *this,bool b)

{
  char *value_00;
  allocator local_69;
  string local_68;
  string local_38 [8];
  string value;
  bool b_local;
  cmake *this_local;
  
  value.field_2._M_local_buf[0xf] = b;
  std::__cxx11::string::string(local_38);
  if ((value.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::operator=(local_38,"FALSE");
  }
  else {
    std::__cxx11::string::operator=(local_38,"TRUE");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CMAKE_ERROR_DEPRECATED",&local_69);
  value_00 = (char *)std::__cxx11::string::c_str();
  AddCacheEntry(this,&local_68,value_00,
                "Whether to issue deprecation errors for macros and functions.",4);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmake::SetDeprecatedWarningsAsErrors(bool b)
{
  std::string value;

  // equivalent to -Werror=deprecated
  if (b) {
    value = "TRUE";
  }
  // equivalent to -Wno-error=deprecated
  else {
    value = "FALSE";
  }

  this->AddCacheEntry("CMAKE_ERROR_DEPRECATED", value.c_str(),
                      "Whether to issue deprecation errors for macros"
                      " and functions.",
                      cmStateEnums::INTERNAL);
}